

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Initialize
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZGeoEl *refel)

{
  byte bVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZTransform<double> *this_00;
  TPZTransform<double> *pTVar4;
  long *in_RSI;
  long *in_RDI;
  TPZTransform<double> NeighTransf;
  TPZGeoElSide NeighSide;
  TPZGeoElSide NextSide;
  TPZGeoElSide ElemSide;
  int byside;
  TPZTransform<double> *in_stack_000006d0;
  TPZGeoElSide *in_stack_000006d8;
  TPZGeoElSide *in_stack_000006e0;
  TPZGeoElSide *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  TPZGeoEl *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  TPZGeoElSide local_228;
  undefined1 local_210 [416];
  undefined1 local_70 [64];
  TPZGeoElSide local_30;
  int local_14;
  long *local_10;
  
  in_RDI[9] = (long)in_RSI;
  local_14 = 8;
  local_10 = in_RSI;
  do {
    if (0x1a < local_14) {
      return;
    }
    iVar2 = (**(code **)(*local_10 + 0x140))(local_10,local_14);
    if (iVar2 == 0) {
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 in_stack_fffffffffffffd68,in_stack_fffffffffffffd64);
      TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffd68);
      pTVar3 = TPZGeoElSide::Element((TPZGeoElSide *)(local_70 + 0x28));
      if (pTVar3 == (TPZGeoEl *)0x0) {
        local_70._24_4_ = 4;
      }
      else {
        while( true ) {
          this_00 = (TPZTransform<double> *)TPZGeoElSide::Element((TPZGeoElSide *)(local_70 + 0x28))
          ;
          pTVar4 = (TPZTransform<double> *)TPZGeoElSide::Element(&local_30);
          if (this_00 == pTVar4) break;
          iVar2 = TPZGeoElSide::Exists((TPZGeoElSide *)(local_70 + 0x28));
          if (iVar2 != 0) {
            pTVar3 = TPZGeoElSide::Element((TPZGeoElSide *)(local_70 + 0x28));
            bVar1 = (**(code **)(*(long *)pTVar3 + 0xd0))();
            if ((bVar1 & 1) == 0) {
              pTVar3 = TPZGeoElSide::Element((TPZGeoElSide *)(local_70 + 0x28));
              bVar1 = (**(code **)(*(long *)pTVar3 + 0xe0))();
              in_stack_fffffffffffffd74 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd74);
              if ((bVar1 & 1) == 0) {
                in_stack_fffffffffffffd68 = (TPZGeoEl *)local_70;
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58);
                in_stack_fffffffffffffd70 =
                     TPZGeoElSide::Dimension
                               ((TPZGeoElSide *)
                                CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
                in_stack_fffffffffffffd64 =
                     TPZGeoElSide::Dimension
                               ((TPZGeoElSide *)
                                CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
                TPZTransform<double>::TPZTransform(this_00,(int)((ulong)pTVar4 >> 0x20),(int)pTVar4)
                ;
                in_stack_fffffffffffffd58 = &local_228;
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58);
                TPZGeoElSide::SideTransform3(in_stack_000006e0,in_stack_000006d8,in_stack_000006d0);
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1641439);
                (**(code **)(*in_RDI + 0x48))(in_RDI,local_14,local_70,local_210);
                local_70._24_4_ = 6;
                TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1641478);
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1641485);
                break;
              }
            }
          }
          TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffd68);
          TPZGeoElSide::operator=
                    ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1641526);
        }
        local_70._24_4_ = 0;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1641543);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1641550);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Initialize(TPZGeoEl *refel)
{
    fGeoEl = refel;
    for(int byside = TGeo::NNodes; byside < (TGeo::NSides); byside++)
    {
        if (refel->SideIsUndefined(byside)) {
            continue;
        }
        TPZGeoElSide ElemSide(refel,byside);
        TPZGeoElSide NextSide(ElemSide.Neighbour());
        if(!NextSide.Element()) continue;
        while(NextSide.Element() != ElemSide.Element())
        {
            if(NextSide.Exists() && !NextSide.Element()->IsLinearMapping() && !NextSide.Element()->IsGeoBlendEl())
            {
                TPZGeoElSide NeighSide = NextSide;
                TPZTransform<> NeighTransf(NeighSide.Dimension(),NeighSide.Dimension());
                ElemSide.SideTransform3(NeighSide,NeighTransf);
                SetNeighbourInfo(byside,NeighSide,NeighTransf);
                break;
            }
            NextSide = NextSide.Neighbour();
        }
    }
}